

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O1

llm_graph_result_ptr __thiscall
llama_context::graph_build
          (llama_context *this,ggml_context *ctx,ggml_cgraph *gf,llama_ubatch *ubatch,
          llm_graph_type gtype)

{
  llm_graph_params *params;
  undefined4 in_register_00000084;
  ggml_context *local_98;
  undefined8 uStack_90;
  code *local_88;
  code *pcStack_80;
  ggml_cgraph *local_70;
  undefined4 local_68;
  ggml_backend_sched **local_60;
  ggml_context *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  ggml_context *local_38;
  ggml_context *local_30;
  undefined8 local_28;
  ggml_context *local_20;
  undefined4 local_18;
  undefined1 *local_10;
  
  local_50 = CONCAT44(in_register_00000084,gtype);
  local_10 = (undefined1 *)&local_98;
  params = *(llm_graph_params **)ctx;
  local_68 = *(undefined4 *)((long)&params->ctx + 4);
  local_60 = &params->sched;
  local_58 = ctx + 8;
  local_48 = *(undefined8 *)(ctx + 0x2a0);
  uStack_40 = *(undefined8 *)(ctx + 0x2a8);
  local_38 = ctx + 0x60;
  local_30 = ctx + 0xb0;
  local_28 = *(undefined8 *)(ctx + 0x220);
  local_20 = ctx + 0x1e0;
  local_18 = *(undefined4 *)(ctx + 0x280);
  uStack_90 = 0;
  pcStack_80 = std::
               _Function_handler<void_(const_llama_ubatch_&,_ggml_tensor_*,_const_char_*,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp:1667:12)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(const_llama_ubatch_&,_ggml_tensor_*,_const_char_*,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp:1667:12)>
             ::_M_manager;
  local_98 = ctx;
  local_70 = gf;
  llama_model::build_graph
            ((llama_model *)this,params,(ggml_cgraph *)&local_70,(llm_graph_type)ubatch);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,3);
  }
  return (__uniq_ptr_data<llm_graph_result_i,_std::default_delete<llm_graph_result_i>,_true,_true>)
         (__uniq_ptr_data<llm_graph_result_i,_std::default_delete<llm_graph_result_i>,_true,_true>)
         this;
}

Assistant:

llm_graph_result_ptr llama_context::graph_build(
            ggml_context * ctx,
             ggml_cgraph * gf,
      const llama_ubatch & ubatch,
            llm_graph_type gtype) {
    return model.build_graph(
            {
                /*.ctx         =*/ ctx,
                /*.arch        =*/ model.arch,
                /*.hparams     =*/ model.hparams,
                /*.cparams     =*/ cparams,
                /*.ubatch      =*/ ubatch,
                /*.sched       =*/ sched.get(),
                /*.backend_cpu =*/ backend_cpu,
                /*.cvec        =*/ &cvec,
                /*.loras       =*/ &loras,
                /*.memory      =*/ kv_self.get(),
                /*.cross       =*/ &cross,
                /*.n_outputs   =*/ n_outputs,
                /*.cb          =*/ graph_get_cb(),
            }, gf, gtype);
}